

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int vrna_E_ext_stem(uint type,int n5d,int n3d,vrna_param_t *p)

{
  int local_24;
  int energy;
  vrna_param_t *p_local;
  int n3d_local;
  int n5d_local;
  uint type_local;
  
  local_24 = 0;
  if ((n5d < 0) || (n3d < 0)) {
    if (n5d < 0) {
      if (-1 < n3d) {
        local_24 = p->dangle3[type][n3d];
      }
    }
    else {
      local_24 = p->dangle5[type][n5d];
    }
  }
  else {
    local_24 = p->mismatchExt[type][n5d][n3d];
  }
  if (2 < type) {
    local_24 = p->TerminalAU + local_24;
  }
  return local_24;
}

Assistant:

PUBLIC int
vrna_E_ext_stem(unsigned int  type,
                int           n5d,
                int           n3d,
                vrna_param_t  *p)
{
  int energy = 0;

  if (n5d >= 0 && n3d >= 0)
    energy += p->mismatchExt[type][n5d][n3d];
  else if (n5d >= 0)
    energy += p->dangle5[type][n5d];
  else if (n3d >= 0)
    energy += p->dangle3[type][n3d];

  if (type > 2)
    energy += p->TerminalAU;

  return energy;
}